

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseVar
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *table)

{
  TokenDetail op;
  TokenDetail *pTVar1;
  undefined8 uVar2;
  ParseException *in_RSI;
  TokenDetail *in_RDI;
  bool bVar3;
  int in_stack_000000cc;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_000000d0;
  ParserImpl *in_stack_000000d8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  int line;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffee8;
  ParserImpl *in_stack_fffffffffffffef0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffef8;
  int line_00;
  MemberAccessor *in_stack_ffffffffffffff00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff08;
  IndexAccessor *in_stack_ffffffffffffff10;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> str;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_50;
  ParserImpl *pPStack_48;
  undefined8 local_40;
  int iStack_3c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_38;
  int local_1c;
  
  str._M_head_impl = (SyntaxTree *)in_RDI;
  NextToken(in_stack_fffffffffffffef0);
  bVar3 = true;
  if (*(int *)&in_RSI[1].super_Exception != 0x5b) {
    bVar3 = *(int *)&in_RSI[1].super_Exception == 0x2e;
  }
  if (!bVar3) {
    __assert_fail("current_.token_ == \'[\' || current_.token_ == \'.\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x295,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseVar(std::unique_ptr<SyntaxTree>)"
                 );
  }
  if (*(int *)&in_RSI[1].super_Exception == 0x5b) {
    pTVar1 = LookAhead(in_stack_fffffffffffffef0);
    local_1c = pTVar1->line_;
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffef0);
    luna::TokenDetail::TokenDetail((TokenDetail *)&local_50);
    op._16_8_ = table;
    op._0_16_ = _exp;
    op._24_8_ = this;
    line_00 = iStack_3c;
    ParseExp(in_stack_000000d8,in_stack_000000d0,op,in_stack_000000cc);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_38);
    pTVar1 = NextToken(pPStack_48);
    if (pTVar1->token_ != 0x5d) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(in_RSI,(char *)str._M_head_impl,in_RDI);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    operator_new(0x20);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_48,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_50.str_
              );
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_48,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_50.str_
              );
    luna::IndexAccessor::IndexAccessor
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,puStack_38,line_00);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_48,
               (pointer)local_50.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_38);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_38);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (puStack_38);
  }
  else {
    pTVar1 = NextToken(in_stack_fffffffffffffef0);
    if (pTVar1->token_ != 0x115) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(in_RSI,(char *)str._M_head_impl,in_RDI);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    operator_new(0x38);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    luna::MemberAccessor::MemberAccessor
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (TokenDetail *)in_stack_fffffffffffffef0);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffef0,(pointer)in_stack_fffffffffffffee8);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff00);
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)str._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseVar(std::unique_ptr<SyntaxTree> table)
        {
            NextToken();
            assert(current_.token_ == '[' || current_.token_ == '.');

            if (current_.token_ == '[')
            {
                int line = LookAhead().line_;
                std::unique_ptr<SyntaxTree> exp = ParseExp();
                if (NextToken().token_ != ']')
                    throw ParseException("expect ']'", current_);
                return std::unique_ptr<SyntaxTree>(new IndexAccessor(std::move(table),
                                                                     std::move(exp),
                                                                     line));
            }
            else
            {
                if (NextToken().token_ != Token_Id)
                    throw ParseException("expect 'id' after '.'", current_);
                return std::unique_ptr<SyntaxTree>(new MemberAccessor(std::move(table), current_));
            }
        }